

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverse.cpp
# Opt level: O2

DefaultInitVec<uint8_t> * readInto(DefaultInitVec<uint8_t> *__return_storage_ptr__,path *path)

{
  int iVar1;
  undefined4 extraout_var;
  streambuf *psVar2;
  long lVar3;
  size_type sVar4;
  int *piVar5;
  char *pcVar6;
  size_type __new_size;
  size_type sVar7;
  size_type sVar8;
  long lVar9;
  string local_140;
  File file;
  
  file._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u.
  _M_first._M_storage =
       (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
       (basic_streambuf<char,_std::char_traits<char>_> *)0x0;
  file._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_index =
       '\0';
  iVar1 = File::open(&file,(char *)path,0xc);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    File::string(&local_140,&file,path);
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fatal("Failed to open \"%s\": %s",local_140._M_dataplus._M_p,pcVar6);
  }
  std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::vector(__return_storage_ptr__,0x800,(allocator_type *)&local_140);
  sVar8 = 0;
  while( true ) {
    sVar7 = (long)(__return_storage_ptr__->
                  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(__return_storage_ptr__->
                  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    psVar2 = File::operator*(&file);
    lVar9 = sVar7 - sVar8;
    lVar3 = (**(code **)(*(long *)psVar2 + 0x40))
                      (psVar2,(__return_storage_ptr__->
                              super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + sVar8,lVar9);
    if (lVar3 != lVar9) {
      std::
      vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::resize(__return_storage_ptr__,lVar3 + sVar8);
      File::~File(&file);
      return __return_storage_ptr__;
    }
    sVar4 = (long)(__return_storage_ptr__->
                  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage -
            (long)(__return_storage_ptr__->
                  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    __new_size = sVar8 * 2;
    if (sVar8 != sVar4) {
      __new_size = sVar4;
    }
    if (sVar8 == __new_size) break;
    std::
    vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>::
    resize(__return_storage_ptr__,__new_size);
    sVar8 = sVar7;
  }
  __assert_fail("oldSize != newSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/reverse.cpp"
                ,0x31,"readInto");
}

Assistant:

static DefaultInitVec<uint8_t> readInto(std::filesystem::path path) {
	File file;
	if (!file.open(path, std::ios::in | std::ios::binary)) {
		fatal("Failed to open \"%s\": %s", file.string(path).c_str(), strerror(errno));
	}
	DefaultInitVec<uint8_t> data(128 * 16); // Begin with some room pre-allocated

	size_t curSize = 0;
	for (;;) {
		size_t oldSize = curSize;
		curSize = data.size();

		// Fill the new area ([oldSize; curSize[) with bytes
		size_t nbRead =
		    file->sgetn(reinterpret_cast<char *>(&data.data()[oldSize]), curSize - oldSize);
		if (nbRead != curSize - oldSize) {
			// Shrink the vector to discard bytes that weren't read
			data.resize(oldSize + nbRead);
			break;
		}
		// If the vector has some capacity left, use it; otherwise, double the current size

		// Arbitrary, but if you got a better idea...
		size_t newSize = oldSize != data.capacity() ? data.capacity() : oldSize * 2;
		assert(oldSize != newSize);
		data.resize(newSize);
	}

	return data;
}